

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void test_uint32_iterator(_Bool run)

{
  _Bool _Var1;
  byte in_DIL;
  uint32_t i_14;
  uint32_t i_13;
  uint32_t i_12;
  uint32_t i_11;
  uint32_t i_10;
  uint32_t i_9;
  uint32_t i_8;
  uint32_t i_7;
  uint32_t i_6;
  uint32_t i_5;
  roaring_uint32_iterator_t *iter;
  char *internal_reason_buf;
  uint32_t i_4;
  uint32_t i_3;
  uint32_t i_2;
  uint32_t i_1;
  uint32_t i;
  roaring_bitmap_t *r1;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  uint uVar2;
  uint32_t in_stack_ffffffffffffffa4;
  uint val;
  undefined4 in_stack_ffffffffffffffa8;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  uint local_40;
  uint local_3c;
  uint32_t in_stack_ffffffffffffffdc;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar5;
  undefined4 in_stack_ffffffffffffffe4;
  uint uVar6;
  uint local_18;
  uint local_14;
  
  roaring_bitmap_create();
  for (local_14 = 0; local_14 < 66000; local_14 = local_14 + 3) {
    roaring_bitmap_add((roaring_bitmap_t *)
                       CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffdc);
  }
  for (local_18 = 100000; local_18 < 200000; local_18 = local_18 + 1) {
    roaring_bitmap_add((roaring_bitmap_t *)
                       CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffdc);
  }
  for (uVar6 = 300000; uVar6 < 500000; uVar6 = uVar6 + 100) {
    roaring_bitmap_add((roaring_bitmap_t *)CONCAT44(uVar6,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffdc);
  }
  for (uVar5 = 600000; uVar5 < 700000; uVar5 = uVar5 + 1) {
    roaring_bitmap_add((roaring_bitmap_t *)CONCAT44(uVar6,uVar5),in_stack_ffffffffffffffdc);
  }
  for (uVar4 = 800000; uVar4 < 900000; uVar4 = uVar4 + 7) {
    roaring_bitmap_add((roaring_bitmap_t *)CONCAT44(uVar6,uVar5),uVar4);
  }
  if ((in_DIL & 1) != 0) {
    roaring_bitmap_run_optimize
              ((roaring_bitmap_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  }
  _Var1 = roaring_bitmap_internal_validate
                    ((roaring_bitmap_t *)
                     CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     (char **)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (!_Var1) {
    print_error("ERROR: internal validation failed: %s\n",0);
    _fail((char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
          in_stack_ffffffffffffff9c);
  }
  roaring_iterator_create
            ((roaring_bitmap_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  for (local_3c = 0; local_3c < 66000; local_3c = local_3c + 3) {
    _assert_true(CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
    _assert_true(CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
    roaring_uint32_iterator_move_equalorlarger
              ((roaring_uint32_iterator_t *)
               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               in_stack_ffffffffffffffa4);
    _assert_true(CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
    _assert_true(CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
    roaring_uint32_iterator_advance
              ((roaring_uint32_iterator_t *)
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  for (local_40 = 100000; local_40 < 200000; local_40 = local_40 + 1) {
    _assert_true(CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
    _assert_true(CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
    roaring_uint32_iterator_move_equalorlarger
              ((roaring_uint32_iterator_t *)
               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               in_stack_ffffffffffffffa4);
    _assert_true(CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
    _assert_true(CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
    roaring_uint32_iterator_advance
              ((roaring_uint32_iterator_t *)
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  for (uVar6 = 300000; uVar6 < 500000; uVar6 = uVar6 + 100) {
    _assert_true(CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
    _assert_true(CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
    roaring_uint32_iterator_move_equalorlarger
              ((roaring_uint32_iterator_t *)
               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               in_stack_ffffffffffffffa4);
    _assert_true(CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
    _assert_true(CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
    roaring_uint32_iterator_advance
              ((roaring_uint32_iterator_t *)
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  for (uVar6 = 600000; uVar6 < 700000; uVar6 = uVar6 + 1) {
    _assert_true(CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
    _assert_true(CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
    roaring_uint32_iterator_move_equalorlarger
              ((roaring_uint32_iterator_t *)
               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               in_stack_ffffffffffffffa4);
    _assert_true(CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
    _assert_true(CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
    roaring_uint32_iterator_advance
              ((roaring_uint32_iterator_t *)
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  for (uVar6 = 800000; uVar6 < 900000; uVar6 = uVar6 + 7) {
    _assert_true(CONCAT44(uVar6,in_stack_ffffffffffffffb0),
                 (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
    _assert_true(CONCAT44(uVar6,in_stack_ffffffffffffffb0),
                 (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
    roaring_uint32_iterator_move_equalorlarger
              ((roaring_uint32_iterator_t *)
               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               in_stack_ffffffffffffffa4);
    _assert_true(CONCAT44(uVar6,in_stack_ffffffffffffffb0),
                 (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
    _assert_true(CONCAT44(uVar6,in_stack_ffffffffffffffb0),
                 (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
    roaring_uint32_iterator_advance
              ((roaring_uint32_iterator_t *)
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  _assert_true(CONCAT44(uVar6,in_stack_ffffffffffffffb0),
               (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
  roaring_uint32_iterator_move_equalorlarger
            ((roaring_uint32_iterator_t *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),in_stack_ffffffffffffffa4
            );
  _assert_true(CONCAT44(uVar6,in_stack_ffffffffffffffb0),
               (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
  _assert_true(CONCAT44(uVar6,in_stack_ffffffffffffffb0),
               (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
  roaring_uint32_iterator_move_equalorlarger
            ((roaring_uint32_iterator_t *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),in_stack_ffffffffffffffa4
            );
  _assert_true(CONCAT44(uVar6,in_stack_ffffffffffffffb0),
               (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
  _assert_true(CONCAT44(uVar6,in_stack_ffffffffffffffb0),
               (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
  roaring_uint32_iterator_move_equalorlarger
            ((roaring_uint32_iterator_t *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),in_stack_ffffffffffffffa4
            );
  _assert_true(CONCAT44(uVar6,in_stack_ffffffffffffffb0),
               (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
  _assert_true(CONCAT44(uVar6,in_stack_ffffffffffffffb0),
               (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
  roaring_uint32_iterator_move_equalorlarger
            ((roaring_uint32_iterator_t *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),in_stack_ffffffffffffffa4
            );
  _assert_true(CONCAT44(uVar6,in_stack_ffffffffffffffb0),
               (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
  _assert_true(CONCAT44(uVar6,in_stack_ffffffffffffffb0),
               (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
  roaring_uint32_iterator_move_equalorlarger
            ((roaring_uint32_iterator_t *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),in_stack_ffffffffffffffa4
            );
  _assert_true(CONCAT44(uVar6,in_stack_ffffffffffffffb0),
               (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
  _assert_true(CONCAT44(uVar6,in_stack_ffffffffffffffb0),
               (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
  roaring_uint32_iterator_move_equalorlarger
            ((roaring_uint32_iterator_t *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),in_stack_ffffffffffffffa4
            );
  _assert_true(CONCAT44(uVar6,in_stack_ffffffffffffffb0),
               (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
  _assert_true(CONCAT44(uVar6,in_stack_ffffffffffffffb0),
               (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
  roaring_uint32_iterator_move_equalorlarger
            ((roaring_uint32_iterator_t *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),in_stack_ffffffffffffffa4
            );
  _assert_true(CONCAT44(uVar6,in_stack_ffffffffffffffb0),
               (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
  _assert_true(CONCAT44(uVar6,in_stack_ffffffffffffffb0),
               (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
  roaring_uint32_iterator_move_equalorlarger
            ((roaring_uint32_iterator_t *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),in_stack_ffffffffffffffa4
            );
  _assert_true(CONCAT44(uVar6,in_stack_ffffffffffffffb0),
               (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
  _assert_true(CONCAT44(uVar6,in_stack_ffffffffffffffb0),
               (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
  roaring_uint32_iterator_move_equalorlarger
            ((roaring_uint32_iterator_t *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),in_stack_ffffffffffffffa4
            );
  _assert_true(CONCAT44(uVar6,in_stack_ffffffffffffffb0),
               (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
  _assert_true(CONCAT44(uVar6,in_stack_ffffffffffffffb0),
               (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
  roaring_uint32_iterator_move_equalorlarger
            ((roaring_uint32_iterator_t *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),in_stack_ffffffffffffffa4
            );
  _assert_true(CONCAT44(uVar6,in_stack_ffffffffffffffb0),
               (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
  roaring_uint32_iterator_move_equalorlarger
            ((roaring_uint32_iterator_t *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),in_stack_ffffffffffffffa4
            );
  for (uVar5 = 0; uVar5 < 66000; uVar5 = uVar5 + 3) {
    _assert_true(CONCAT44(uVar6,uVar5),
                 (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
    _assert_true(CONCAT44(uVar6,uVar5),
                 (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
    roaring_uint32_iterator_move_equalorlarger
              ((roaring_uint32_iterator_t *)
               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               in_stack_ffffffffffffffa4);
  }
  for (uVar4 = 100000; uVar4 < 200000; uVar4 = uVar4 + 1) {
    _assert_true(CONCAT44(uVar6,uVar5),(char *)CONCAT44(uVar4,in_stack_ffffffffffffffa8),
                 (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
    _assert_true(CONCAT44(uVar6,uVar5),(char *)CONCAT44(uVar4,in_stack_ffffffffffffffa8),
                 (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
    roaring_uint32_iterator_move_equalorlarger
              ((roaring_uint32_iterator_t *)CONCAT44(uVar4,in_stack_ffffffffffffffa8),
               in_stack_ffffffffffffffa4);
  }
  for (uVar3 = 300000; uVar3 < 500000; uVar3 = uVar3 + 100) {
    _assert_true(CONCAT44(uVar6,uVar5),(char *)CONCAT44(uVar4,uVar3),
                 (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
    _assert_true(CONCAT44(uVar6,uVar5),(char *)CONCAT44(uVar4,uVar3),
                 (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
    roaring_uint32_iterator_move_equalorlarger
              ((roaring_uint32_iterator_t *)CONCAT44(uVar4,uVar3),in_stack_ffffffffffffffa4);
  }
  for (val = 600000; val < 700000; val = val + 1) {
    _assert_true(CONCAT44(uVar6,uVar5),(char *)CONCAT44(uVar4,uVar3),
                 (char *)CONCAT44(val,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c);
    _assert_true(CONCAT44(uVar6,uVar5),(char *)CONCAT44(uVar4,uVar3),
                 (char *)CONCAT44(val,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c);
    roaring_uint32_iterator_move_equalorlarger
              ((roaring_uint32_iterator_t *)CONCAT44(uVar4,uVar3),val);
  }
  for (uVar2 = 800000; uVar2 < 900000; uVar2 = uVar2 + 7) {
    _assert_true(CONCAT44(uVar6,uVar5),(char *)CONCAT44(uVar4,uVar3),(char *)CONCAT44(val,uVar2),
                 in_stack_ffffffffffffff9c);
    _assert_true(CONCAT44(uVar6,uVar5),(char *)CONCAT44(uVar4,uVar3),(char *)CONCAT44(val,uVar2),
                 in_stack_ffffffffffffff9c);
    roaring_uint32_iterator_move_equalorlarger
              ((roaring_uint32_iterator_t *)CONCAT44(uVar4,uVar3),val);
  }
  _assert_true(CONCAT44(uVar6,uVar5),(char *)CONCAT44(uVar4,uVar3),(char *)CONCAT44(val,uVar2),
               in_stack_ffffffffffffff9c);
  roaring_uint32_iterator_free((roaring_uint32_iterator_t *)0x10601a);
  roaring_bitmap_free((roaring_bitmap_t *)0x106024);
  return;
}

Assistant:

void test_uint32_iterator(bool run) {
    roaring_bitmap_t *r1 = roaring_bitmap_create();
    for (uint32_t i = 0; i < 66000; i += 3) {
        roaring_bitmap_add(r1, i);
    }
    for (uint32_t i = 100000; i < 200000; i++) {
        roaring_bitmap_add(r1, i);
    }
    for (uint32_t i = 300000; i < 500000; i += 100) {
        roaring_bitmap_add(r1, i);
    }
    for (uint32_t i = 600000; i < 700000; i += 1) {
        roaring_bitmap_add(r1, i);
    }
    for (uint32_t i = 800000; i < 900000; i += 7) {
        roaring_bitmap_add(r1, i);
    }
    if (run) roaring_bitmap_run_optimize(r1);
    assert_bitmap_validate(r1);
    roaring_uint32_iterator_t *iter = roaring_iterator_create(r1);
    for (uint32_t i = 0; i < 66000; i += 3) {
        assert_true(iter->has_value);
        assert_true(iter->current_value == i);
        roaring_uint32_iterator_move_equalorlarger(iter, i);
        assert_true(iter->has_value);
        assert_true(iter->current_value == i);
        roaring_uint32_iterator_advance(iter);
    }
    for (uint32_t i = 100000; i < 200000; i++) {
        assert_true(iter->has_value);
        assert_true(iter->current_value == i);
        roaring_uint32_iterator_move_equalorlarger(iter, i);
        assert_true(iter->has_value);
        assert_true(iter->current_value == i);
        roaring_uint32_iterator_advance(iter);
    }
    for (uint32_t i = 300000; i < 500000; i += 100) {
        assert_true(iter->has_value);
        assert_true(iter->current_value == i);
        roaring_uint32_iterator_move_equalorlarger(iter, i);
        assert_true(iter->has_value);
        assert_true(iter->current_value == i);
        roaring_uint32_iterator_advance(iter);
    }
    for (uint32_t i = 600000; i < 700000; i += 1) {
        assert_true(iter->has_value);
        assert_true(iter->current_value == i);
        roaring_uint32_iterator_move_equalorlarger(iter, i);
        assert_true(iter->has_value);
        assert_true(iter->current_value == i);
        roaring_uint32_iterator_advance(iter);
    }
    for (uint32_t i = 800000; i < 900000; i += 7) {
        assert_true(iter->has_value);
        assert_true(iter->current_value == i);
        roaring_uint32_iterator_move_equalorlarger(iter, i);
        assert_true(iter->has_value);
        assert_true(iter->current_value == i);
        roaring_uint32_iterator_advance(iter);
    }
    assert_false(iter->has_value);
    roaring_uint32_iterator_move_equalorlarger(iter, 0);
    assert_true(iter->has_value);
    assert_true(iter->current_value == 0);
    roaring_uint32_iterator_move_equalorlarger(iter, 66000);
    assert_true(iter->has_value);
    assert_true(iter->current_value == 100000);
    roaring_uint32_iterator_move_equalorlarger(iter, 100000);
    assert_true(iter->has_value);
    assert_true(iter->current_value == 100000);
    roaring_uint32_iterator_move_equalorlarger(iter, 200000);
    assert_true(iter->has_value);
    assert_true(iter->current_value == 300000);
    roaring_uint32_iterator_move_equalorlarger(iter, 300000);
    assert_true(iter->has_value);
    assert_true(iter->current_value == 300000);
    roaring_uint32_iterator_move_equalorlarger(iter, 500000);
    assert_true(iter->has_value);
    assert_true(iter->current_value == 600000);
    roaring_uint32_iterator_move_equalorlarger(iter, 600000);
    assert_true(iter->has_value);
    assert_true(iter->current_value == 600000);
    roaring_uint32_iterator_move_equalorlarger(iter, 700000);
    assert_true(iter->has_value);
    assert_true(iter->current_value == 800000);
    roaring_uint32_iterator_move_equalorlarger(iter, 800000);
    assert_true(iter->has_value);
    assert_true(iter->current_value == 800000);
    roaring_uint32_iterator_move_equalorlarger(iter, 900000);
    assert_false(iter->has_value);
    roaring_uint32_iterator_move_equalorlarger(iter, 0);
    for (uint32_t i = 0; i < 66000; i += 3) {
        assert_true(iter->has_value);
        assert_true(iter->current_value == i);
        roaring_uint32_iterator_move_equalorlarger(iter, i + 1);
    }
    for (uint32_t i = 100000; i < 200000; i++) {
        assert_true(iter->has_value);
        assert_true(iter->current_value == i);
        roaring_uint32_iterator_move_equalorlarger(iter, i + 1);
    }
    for (uint32_t i = 300000; i < 500000; i += 100) {
        assert_true(iter->has_value);
        assert_true(iter->current_value == i);
        roaring_uint32_iterator_move_equalorlarger(iter, i + 1);
    }
    for (uint32_t i = 600000; i < 700000; i += 1) {
        assert_true(iter->has_value);
        assert_true(iter->current_value == i);
        roaring_uint32_iterator_move_equalorlarger(iter, i + 1);
    }
    for (uint32_t i = 800000; i < 900000; i += 7) {
        assert_true(iter->has_value);
        assert_true(iter->current_value == i);
        roaring_uint32_iterator_move_equalorlarger(iter, i + 1);
    }
    assert_false(iter->has_value);

    roaring_uint32_iterator_free(iter);
    roaring_bitmap_free(r1);
}